

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
opt_dereferenceOperatorConstRvalue_Test::TestBody(opt_dereferenceOperatorConstRvalue_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  underlying_type d;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  byte local_59;
  AssertHelper local_58;
  storage_type local_50;
  undefined7 uStack_4f;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  storage_type local_38;
  undefined7 uStack_37;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_59 = 1;
  mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>::
  opt<signed_char_&,_true,_true>
            ((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
              *)&local_38.value,(char *)0x1);
  local_50 = (storage_type)(local_38.null_value != '\a');
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_50.null_value) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_38.value,(internal *)&local_50.value,(AssertionResult *)0x1b8a47,
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x399,(char *)CONCAT71(uStack_37,local_38.null_value));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(uStack_37,local_38.null_value) != &local_28) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(uStack_37,local_38.null_value),local_28._M_allocated_capacity + 1)
      ;
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>::
  opt<signed_char_&,_true,_true>
            ((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
              *)&local_38.value,(char *)(ulong)local_59);
  local_50 = (storage_type)(local_38.null_value != '\a');
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_50.null_value) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_38.value,(internal *)&local_50.value,
               (AssertionResult *)"make().has_value()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x39a,(char *)CONCAT71(uStack_37,local_38.null_value));
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(uStack_37,local_38.null_value) != &local_28) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(uStack_37,local_38.null_value),local_28._M_allocated_capacity + 1)
      ;
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>::
  opt<signed_char_&,_true,_true>
            ((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
              *)&local_50.value,(char *)(ulong)local_59);
  if (local_50.null_value != '\a') {
    testing::internal::EqHelper<false>::Compare<signed_char,(anonymous_namespace)::weekday>
              (&local_38.null_value,"*make()",(char *)&local_59,&local_50.value);
    if (local_38.null_value == '\0') {
      testing::Message::Message((Message *)&local_50.value);
      if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x39b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50.value);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (CONCAT71(uStack_4f,local_50.null_value) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT71(uStack_4f,local_50.null_value) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(uStack_4f,local_50.null_value) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
    ::opt<signed_char_&,_true,_true>
              ((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
                *)&local_50.value,(char *)(ulong)local_59);
    mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
    ::value((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
             *)&local_50.value);
    testing::internal::EqHelper<false>::Compare<signed_char,(anonymous_namespace)::weekday>
              (&local_38.null_value,"make().value()",(char *)&local_59,&local_50.value);
    if (local_38.null_value == '\0') {
      testing::Message::Message((Message *)&local_50.value);
      if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x39c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50.value);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (CONCAT71(uStack_4f,local_50.null_value) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT71(uStack_4f,local_50.null_value) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(uStack_4f,local_50.null_value) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
    ::opt<signed_char_&,_true,_true>
              ((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
                *)&local_50.value,(char *)(ulong)local_59);
    if (local_50.null_value != '\a') {
      testing::internal::CmpHelperEQ<signed_char,signed_char>
                ((internal *)&local_38.value,"d","make()->get()",(char *)&local_59,
                 &local_50.null_value);
      if (local_38.null_value == '\0') {
        testing::Message::Message((Message *)&local_50.value);
        if (local_30.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                   ,0x39d,pcVar2);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50.value);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (CONCAT71(uStack_4f,local_50.null_value) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)CONCAT71(uStack_4f,local_50.null_value) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(uStack_4f,local_50.null_value) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      mp::
      opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>::
      opt<signed_char_&,_true,_true>
                ((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
                  *)&local_50.value,(char *)(ulong)local_59);
      if (local_50.null_value == '\a') {
        anon_unknown.dwarf_fb49::weekday::weekday(&local_50.value,'\x03');
      }
      testing::internal::EqHelper<false>::Compare<signed_char,(anonymous_namespace)::weekday>
                (&local_38.null_value,"make().value_or(weekday::underlying_type{3})",
                 (char *)&local_59,&local_50.value);
      if (local_38.null_value == '\0') {
        testing::Message::Message((Message *)&local_50.value);
        if (local_30.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                   ,0x39e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50.value);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (CONCAT71(uStack_4f,local_50.null_value) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)CONCAT71(uStack_4f,local_50.null_value) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(uStack_4f,local_50.null_value) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    __assert_fail("has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/include/opt.h",
                  0xdc,
                  "const T *mp::opt<(anonymous namespace)::weekday>::operator->() const [T = (anonymous namespace)::weekday, Policy = mp::opt_default_policy<weekday>]"
                 );
  }
  __assert_fail("has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/include/opt.h",
                0xe1,
                "const T &&mp::opt<(anonymous namespace)::weekday>::operator*() const && [T = (anonymous namespace)::weekday, Policy = mp::opt_default_policy<weekday>]"
               );
}

Assistant:

TEST(opt, dereferenceOperatorConstRvalue)
{
  weekday::underlying_type d{1};
  auto make = [&]() -> const opt<weekday> { return opt<weekday>{d}; };
  EXPECT_TRUE(make());
  EXPECT_TRUE(make().has_value());
  EXPECT_EQ(d, *make());
  EXPECT_EQ(d, make().value());
  EXPECT_EQ(d, make()->get());
  EXPECT_EQ(d, make().value_or(weekday::underlying_type{3}));
}